

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void google::protobuf::FieldOptions_EditionDefault::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  ulong uVar2;
  Nonnull<const_char_*> pcVar3;
  Arena *arena;
  
  if (from_msg == to_msg) {
    pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (from_msg,to_msg,"&from != _this");
  }
  else {
    pcVar3 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar3 != (Nonnull<const_char_*>)0x0) {
    MergeImpl();
  }
  uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      uVar2 = from_msg[1]._internal_metadata_.ptr_;
      *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 1;
      arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
      if (((ulong)arena & 1) != 0) {
        arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
      }
      protobuf::internal::ArenaStringPtr::Set<>
                ((ArenaStringPtr *)&to_msg[1]._internal_metadata_,
                 (string *)(uVar2 & 0xfffffffffffffffc),arena);
    }
    if ((uVar1 & 2) != 0) {
      *(undefined4 *)&to_msg[2]._vptr_MessageLite = *(undefined4 *)&from_msg[2]._vptr_MessageLite;
    }
  }
  *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | uVar1;
  uVar2 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar2 & 1) == 0) {
    return;
  }
  protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
            (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8));
  return;
}

Assistant:

void FieldOptions_EditionDefault::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<FieldOptions_EditionDefault*>(&to_msg);
  auto& from = static_cast<const FieldOptions_EditionDefault&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.FieldOptions.EditionDefault)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_value(from._internal_value());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_impl_.edition_ = from._impl_.edition_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}